

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O3

void __thiscall E64::hud_t::redraw(hud_t *this)

{
  bool bVar1;
  
  blitter_ic::clear_framebuffer(this->blitter);
  if (this->stats_visible == true) {
    blitter_ic::add_operation_draw_blit(this->blitter,this->blitter->blit);
  }
  if (this->notify_frame_counter != 0) {
    blitter_ic::add_operation_draw_blit(this->blitter,this->blitter->blit + 1);
    this->notify_frame_counter = this->notify_frame_counter - 1;
  }
  do {
    bVar1 = blitter_ic::run_next_operation(this->blitter);
  } while (bVar1);
  return;
}

Assistant:

void E64::hud_t::redraw()
{
	blitter->clear_framebuffer();
	if (stats_visible) blitter->add_operation_draw_blit(&blitter->blit[0]);
	if (notify_frame_counter != 0) {
		blitter->add_operation_draw_blit(&blitter->blit[1]);
		notify_frame_counter--;
	}
	while (blitter->run_next_operation()) {}
}